

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void raw_enqueue_event(CManager_conflict cm,queue_ptr queue,event_item *event)

{
  long lVar1;
  undefined8 *puVar2;
  event_item *in_RDX;
  long *in_RSI;
  long in_RDI;
  event_path_data evp;
  queue_item *item;
  size_t in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 0x118);
  if (*(long *)(lVar1 + 0x58) == 0) {
    puVar2 = (undefined8 *)INT_CMmalloc(in_stack_ffffffffffffffe0);
  }
  else {
    puVar2 = *(undefined8 **)(lVar1 + 0x58);
    *(undefined8 *)(lVar1 + 0x58) = puVar2[2];
  }
  *puVar2 = in_RDX;
  *(undefined4 *)(puVar2 + 1) = 0;
  reference_event(in_RDX);
  if (*in_RSI == 0) {
    *in_RSI = (long)puVar2;
    in_RSI[1] = (long)puVar2;
    puVar2[2] = 0;
  }
  else {
    *(undefined8 **)(in_RSI[1] + 0x10) = puVar2;
    in_RSI[1] = (long)puVar2;
    puVar2[2] = 0;
  }
  return;
}

Assistant:

static void
raw_enqueue_event(CManager cm, queue_ptr queue, event_item *event)
{
    queue_item *item;
    event_path_data evp = cm->evp;
    if (evp->queue_items_free_list == NULL) {
	item = malloc(sizeof(*item));
    } else {
	item = evp->queue_items_free_list;
	evp->queue_items_free_list = item->next;
    }
    item->item = event;
    item->handled = 0;
    reference_event(event);
    if (queue->queue_head == NULL) {
	queue->queue_head = item;
	queue->queue_tail = item;
	item->next = NULL;
    } else {
	queue->queue_tail->next = item;
	queue->queue_tail = item;
	item->next = NULL;
    }
}